

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O3

void Am_Move_Cursor_To_End(Am_Object *text)

{
  int value;
  Am_Value *in_value;
  char *p;
  Am_Object AStack_28;
  Am_String local_20;
  
  in_value = Am_Object::Get(text,0xab,0);
  Am_String::Am_String(&local_20,in_value);
  p = Am_String::operator_cast_to_char_(&local_20);
  value = ml_strlen(p);
  Am_String::~Am_String(&local_20);
  Am_Object::Set(text,0xad,value,0);
  Am_Object::Am_Object(&AStack_28,text);
  Am_Object::Set(&AStack_28,0xe4,false,0);
  Am_Object::Set(&AStack_28,0xaf,false,0);
  Am_Object::~Am_Object(&AStack_28);
  return;
}

Assistant:

void
Am_Move_Cursor_To_End(Am_Object text)
{
  int str_len = ml_strlen(Am_String(text.Get(Am_TEXT)));
  text.Set(Am_CURSOR_INDEX, str_len);
  Am_Set_Pending_Delete(text, false);
}